

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O3

void __thiscall
double_conversion::DoubleToStringConverter::CreateExponentialRepresentation
          (DoubleToStringConverter *this,char *decimal_digits,int length,int exponent,
          StringBuilder *result_builder)

{
  char cVar1;
  ulong in_RAX;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  char buffer [6];
  undefined8 local_28;
  
  cVar1 = *decimal_digits;
  iVar6 = result_builder->position_;
  result_builder->position_ = iVar6 + 1;
  (result_builder->buffer_).start_[iVar6] = cVar1;
  iVar6 = result_builder->position_;
  local_28 = in_RAX;
  if (length != 1) {
    result_builder->position_ = iVar6 + 1;
    (result_builder->buffer_).start_[iVar6] = '.';
    memmove((result_builder->buffer_).start_ + result_builder->position_,decimal_digits + 1,
            (long)(length + -1));
    iVar6 = length + -1 + result_builder->position_;
  }
  cVar1 = this->exponent_character_;
  result_builder->position_ = iVar6 + 1;
  (result_builder->buffer_).start_[iVar6] = cVar1;
  if (exponent < 0) {
    iVar6 = result_builder->position_;
    result_builder->position_ = iVar6 + 1;
    (result_builder->buffer_).start_[iVar6] = '-';
    exponent = -exponent;
  }
  else {
    if ((this->flags_ & 1) != 0) {
      iVar6 = result_builder->position_;
      result_builder->position_ = iVar6 + 1;
      (result_builder->buffer_).start_[iVar6] = '+';
    }
    if (exponent == 0) {
      iVar6 = result_builder->position_;
      result_builder->position_ = iVar6 + 1;
      (result_builder->buffer_).start_[iVar6] = '0';
      return;
    }
  }
  local_28 = local_28 & 0xffffffffffffff;
  lVar7 = 5;
  lVar2 = 0x400000000;
  iVar6 = 1;
  do {
    iVar5 = iVar6;
    lVar2 = lVar2 + -0x100000000;
    *(byte *)((long)&local_28 + lVar7 + 1) =
         (char)exponent + (char)((uint)exponent / 10) * -10 | 0x30;
    lVar7 = lVar7 + -1;
    bVar8 = 9 < (uint)exponent;
    exponent = (uint)exponent / 10;
    iVar6 = iVar5 + 1;
  } while (bVar8);
  iVar6 = 5;
  if (this->min_exponent_width_ < 5) {
    iVar6 = this->min_exponent_width_;
  }
  if (iVar5 < iVar6) {
    uVar4 = (ulong)(uint)(iVar6 - (iVar5 + 1));
    memset((void *)((long)&local_28 + ((lVar2 >> 0x20) - uVar4) + 2),0x30,uVar4 + 1);
    lVar2 = -(long)(int)lVar7;
    do {
      iVar5 = iVar5 + 1;
      lVar7 = lVar2 + 1;
      lVar3 = lVar2 + 6;
      lVar2 = lVar7;
    } while (lVar3 < iVar6);
    lVar7 = -lVar7;
  }
  memcpy((result_builder->buffer_).start_ + result_builder->position_,
         (void *)((long)&local_28 + (long)(int)lVar7 + 2),(long)iVar5);
  result_builder->position_ = result_builder->position_ + iVar5;
  return;
}

Assistant:

void DoubleToStringConverter::CreateExponentialRepresentation(
    const char* decimal_digits,
    int length,
    int exponent,
    StringBuilder* result_builder) const {
  DOUBLE_CONVERSION_ASSERT(length != 0);
  result_builder->AddCharacter(decimal_digits[0]);
  if (length != 1) {
    result_builder->AddCharacter('.');
    result_builder->AddSubstring(&decimal_digits[1], length-1);
  }
  result_builder->AddCharacter(exponent_character_);
  if (exponent < 0) {
    result_builder->AddCharacter('-');
    exponent = -exponent;
  } else {
    if ((flags_ & EMIT_POSITIVE_EXPONENT_SIGN) != 0) {
      result_builder->AddCharacter('+');
    }
  }
  if (exponent == 0) {
    result_builder->AddCharacter('0');
    return;
  }
  DOUBLE_CONVERSION_ASSERT(exponent < 1e4);
  // Changing this constant requires updating the comment of DoubleToStringConverter constructor
  const int kMaxExponentLength = 5;
  char buffer[kMaxExponentLength + 1];
  buffer[kMaxExponentLength] = '\0';
  int first_char_pos = kMaxExponentLength;
  while (exponent > 0) {
    buffer[--first_char_pos] = '0' + (exponent % 10);
    exponent /= 10;
  }
  // Add prefix '0' to make exponent width >= min(min_exponent_with_, kMaxExponentLength)
  // For example: convert 1e+9 -> 1e+09, if min_exponent_with_ is set to 2
  while(kMaxExponentLength - first_char_pos < std::min(min_exponent_width_, kMaxExponentLength)) {
    buffer[--first_char_pos] = '0';
  }
  result_builder->AddSubstring(&buffer[first_char_pos],
                               kMaxExponentLength - first_char_pos);
}